

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>::format
          (source_funcname_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  fmt_helper *this_00;
  bool bVar1;
  memory_buf_t *dest_00;
  string_view_t view;
  size_t local_c0;
  undefined1 local_90 [8];
  scoped_padder p;
  size_t text_size;
  scoped_padder p_1;
  memory_buf_t *dest_local;
  tm *param_2_local;
  log_msg *msg_local;
  source_funcname_formatter<spdlog::details::scoped_padder> *this_local;
  
  p_1.spaces_.size_ = (size_t)dest;
  bVar1 = source_loc::empty(&msg->source);
  if (bVar1) {
    scoped_padder::scoped_padder
              ((scoped_padder *)&text_size,0,&(this->super_flag_formatter).padinfo_,
               (memory_buf_t *)p_1.spaces_.size_);
    scoped_padder::~scoped_padder((scoped_padder *)&text_size);
  }
  else {
    bVar1 = padding_info::enabled(&(this->super_flag_formatter).padinfo_);
    if (bVar1) {
      local_c0 = std::char_traits<char>::length((msg->source).funcname);
    }
    else {
      local_c0 = 0;
    }
    p.spaces_.size_ = local_c0;
    scoped_padder::scoped_padder
              ((scoped_padder *)local_90,local_c0,&(this->super_flag_formatter).padinfo_,
               (memory_buf_t *)p_1.spaces_.size_);
    this_00 = (fmt_helper *)(msg->source).funcname;
    dest_00 = (memory_buf_t *)std::char_traits<char>::length((char_type *)this_00);
    view.size_ = p_1.spaces_.size_;
    view.data_ = (char *)dest_00;
    fmt_helper::append_string_view(this_00,view,dest_00);
    scoped_padder::~scoped_padder((scoped_padder *)local_90);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        if (msg.source.empty()) {
            ScopedPadder p(0, padinfo_, dest);
            return;
        }
        size_t text_size =
            padinfo_.enabled() ? std::char_traits<char>::length(msg.source.funcname) : 0;
        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(msg.source.funcname, dest);
    }